

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProjectionMatrix4.h
# Opt level: O0

void Gs::ProjectionMatrix4T<float>::Planar
               (Matrix<float,_4UL,_4UL> *m,float *width,float *height,PlanarProjectionOrigin origin)

{
  float fVar1;
  float *pfVar2;
  PlanarProjectionOrigin origin_local;
  float *height_local;
  float *width_local;
  Matrix<float,_4UL,_4UL> *m_local;
  
  fVar1 = *width;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,0,0);
  *pfVar2 = 2.0 / fVar1;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,1,0);
  *pfVar2 = 0.0;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,2,0);
  *pfVar2 = 0.0;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,3,0);
  *pfVar2 = 0.0;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,0,1);
  *pfVar2 = 0.0;
  fVar1 = *height;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,1,1);
  *pfVar2 = 2.0 / fVar1;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,2,1);
  *pfVar2 = 0.0;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,3,1);
  *pfVar2 = 0.0;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,0,2);
  *pfVar2 = 0.0;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,1,2);
  *pfVar2 = 0.0;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,2,2);
  *pfVar2 = 1.0;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,3,2);
  *pfVar2 = 0.0;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,0,3);
  *pfVar2 = -1.0;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,1,3);
  *pfVar2 = -1.0;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,2,3);
  *pfVar2 = 0.0;
  pfVar2 = Matrix<float,_4UL,_4UL>::At(m,3,3);
  *pfVar2 = 1.0;
  if ((origin == LeftTop) || (origin == RightTop)) {
    pfVar2 = Matrix<float,_4UL,_4UL>::At(m,1,1);
    fVar1 = *pfVar2;
    pfVar2 = Matrix<float,_4UL,_4UL>::At(m,1,1);
    *pfVar2 = -fVar1;
    pfVar2 = Matrix<float,_4UL,_4UL>::At(m,1,3);
    fVar1 = *pfVar2;
    pfVar2 = Matrix<float,_4UL,_4UL>::At(m,1,3);
    *pfVar2 = -fVar1;
  }
  if ((origin == RightTop) || (origin == RightBottom)) {
    pfVar2 = Matrix<float,_4UL,_4UL>::At(m,0,0);
    fVar1 = *pfVar2;
    pfVar2 = Matrix<float,_4UL,_4UL>::At(m,0,0);
    *pfVar2 = -fVar1;
    pfVar2 = Matrix<float,_4UL,_4UL>::At(m,0,3);
    fVar1 = *pfVar2;
    pfVar2 = Matrix<float,_4UL,_4UL>::At(m,0,3);
    *pfVar2 = -fVar1;
  }
  return;
}

Assistant:

static void Planar(Matrix<T, 4, 4>& m, const T& width, const T& height, const PlanarProjectionOrigin origin = PlanarProjectionOrigin::LeftTop)
        {
            m.At(0, 0) = T(2)/width;
            m.At(1, 0) = T(0);
            m.At(2, 0) = T(0);
            m.At(3, 0) = T(0);

            m.At(0, 1) = T(0);
            m.At(1, 1) = T(2)/height;
            m.At(2, 1) = T(0);
            m.At(3, 1) = T(0);

            m.At(0, 2) = T(0);
            m.At(1, 2) = T(0);
            m.At(2, 2) = T(1);
            m.At(3, 2) = T(0);

            m.At(0, 3) = T(-1);
            m.At(1, 3) = T(-1);
            m.At(2, 3) = T(0);
            m.At(3, 3) = T(1);

            if (origin == PlanarProjectionOrigin::LeftTop || origin == PlanarProjectionOrigin::RightTop)
            {
                m.At(1, 1) = -m.At(1, 1);
                m.At(1, 3) = -m.At(1, 3);
            }
            if (origin == PlanarProjectionOrigin::RightTop || origin == PlanarProjectionOrigin::RightBottom)
            {
                m.At(0, 0) = -m.At(0, 0);
                m.At(0, 3) = -m.At(0, 3);
            }
        }